

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall
llvm::raw_ostream::write_escaped(raw_ostream *this,StringRef Str,bool UseHexEscapes)

{
  byte C;
  bool bVar1;
  char cVar2;
  iterator pcVar3;
  raw_ostream *prVar4;
  uchar c;
  iterator __end1;
  iterator __begin1;
  StringRef *__range1;
  bool UseHexEscapes_local;
  raw_ostream *this_local;
  StringRef Str_local;
  
  Str_local.Data = (char *)Str.Length;
  this_local = (raw_ostream *)Str.Data;
  __end1 = StringRef::begin((StringRef *)&this_local);
  pcVar3 = StringRef::end((StringRef *)&this_local);
  for (; __end1 != pcVar3; __end1 = __end1 + 1) {
    C = *__end1;
    if (C == 9) {
      prVar4 = operator<<(this,'\\');
      operator<<(prVar4,'t');
    }
    else if (C == 10) {
      prVar4 = operator<<(this,'\\');
      operator<<(prVar4,'n');
    }
    else if (C == 0x22) {
      prVar4 = operator<<(this,'\\');
      operator<<(prVar4,'\"');
    }
    else if (C == 0x5c) {
      prVar4 = operator<<(this,'\\');
      operator<<(prVar4,'\\');
    }
    else {
      bVar1 = isPrint(C);
      if (bVar1) {
        operator<<(this,C);
      }
      else if (UseHexEscapes) {
        prVar4 = operator<<(this,'\\');
        operator<<(prVar4,'x');
        cVar2 = hexdigit((int)(uint)C >> 4,false);
        operator<<(this,cVar2);
        cVar2 = hexdigit(C & 0xf,false);
        operator<<(this,cVar2);
      }
      else {
        operator<<(this,'\\');
        operator<<(this,(char)((int)(uint)C >> 6) + '0');
        operator<<(this,((byte)((int)(uint)C >> 3) & 7) + 0x30);
        operator<<(this,(C & 7) + 0x30);
      }
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::write_escaped(StringRef Str,
                                        bool UseHexEscapes) {
  for (unsigned char c : Str) {
    switch (c) {
    case '\\':
      *this << '\\' << '\\';
      break;
    case '\t':
      *this << '\\' << 't';
      break;
    case '\n':
      *this << '\\' << 'n';
      break;
    case '"':
      *this << '\\' << '"';
      break;
    default:
      if (isPrint(c)) {
        *this << c;
        break;
      }

      // Write out the escaped representation.
      if (UseHexEscapes) {
        *this << '\\' << 'x';
        *this << hexdigit((c >> 4 & 0xF));
        *this << hexdigit((c >> 0) & 0xF);
      } else {
        // Always use a full 3-character octal escape.
        *this << '\\';
        *this << char('0' + ((c >> 6) & 7));
        *this << char('0' + ((c >> 3) & 7));
        *this << char('0' + ((c >> 0) & 7));
      }
    }
  }

  return *this;
}